

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_2> __thiscall
tcu::select<float,2>
          (tcu *this,Vector<float,_2> *trueVal,Vector<float,_2> *falseVal,Vector<bool,_2> *cond)

{
  Vector<float,_2> VVar1;
  Vector<float,_2> *res;
  long lVar2;
  float *pfVar3;
  float in_XMM0_Da;
  float in_XMM0_Db;
  
  *(undefined8 *)this = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    pfVar3 = trueVal->m_data;
    if (cond->m_data[lVar2] == false) {
      pfVar3 = falseVal->m_data;
    }
    in_XMM0_Da = *pfVar3;
    in_XMM0_Db = 0.0;
    *(float *)(this + lVar2 * 4) = in_XMM0_Da;
    falseVal = (Vector<float,_2> *)((long)falseVal + 4);
    trueVal = (Vector<float,_2> *)((long)trueVal + 4);
  }
  VVar1.m_data[1] = in_XMM0_Db;
  VVar1.m_data[0] = in_XMM0_Da;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}